

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void merge_colors(uint16_t *colors,uint16_t *cached_colors,int n_colors,int n_cached_colors)

{
  int i;
  int trans_idx;
  int cache_idx;
  int n_cached_colors_local;
  int n_colors_local;
  uint16_t *cached_colors_local;
  uint16_t *colors_local;
  
  if (n_cached_colors != 0) {
    cache_idx = 0;
    trans_idx = n_cached_colors;
    for (i = 0; i < n_colors; i = i + 1) {
      if ((cache_idx < n_cached_colors) &&
         ((n_colors <= trans_idx || (cached_colors[cache_idx] <= colors[trans_idx])))) {
        colors[i] = cached_colors[cache_idx];
        cache_idx = cache_idx + 1;
      }
      else {
        colors[i] = colors[trans_idx];
        trans_idx = trans_idx + 1;
      }
    }
  }
  return;
}

Assistant:

static void merge_colors(uint16_t *colors, uint16_t *cached_colors,
                         int n_colors, int n_cached_colors) {
  if (n_cached_colors == 0) return;
  int cache_idx = 0, trans_idx = n_cached_colors;
  for (int i = 0; i < n_colors; ++i) {
    if (cache_idx < n_cached_colors &&
        (trans_idx >= n_colors ||
         cached_colors[cache_idx] <= colors[trans_idx])) {
      colors[i] = cached_colors[cache_idx++];
    } else {
      assert(trans_idx < n_colors);
      colors[i] = colors[trans_idx++];
    }
  }
}